

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O0

void __thiscall
TPZStream::Read<TPZPostProcVar>(TPZStream *this,TPZVec<TPZPostProcVar> *vec,void *context)

{
  TPZPostProcVar *pTVar1;
  undefined8 in_RDX;
  TPZVec<TPZPostProcVar> *in_RSI;
  long *in_RDI;
  int64_t nc;
  int64_t c;
  long local_28;
  long local_20;
  undefined8 local_18;
  TPZVec<TPZPostProcVar> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0xf8))(in_RDI,&local_28,1);
  (*local_10->_vptr_TPZVec[3])(local_10,local_28);
  for (local_20 = 0; local_20 < local_28; local_20 = local_20 + 1) {
    pTVar1 = TPZVec<TPZPostProcVar>::operator[](local_10,local_20);
    (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[6])(pTVar1,in_RDI,local_18);
  }
  return;
}

Assistant:

void Read(TPZVec<T> &vec, void *context) {
        int64_t c, nc;
        this->Read(&nc, 1);
        vec.Resize(nc);
        if constexpr (std::is_same<std::string,T>::value ||
                      is_arithmetic_pz<T>::value){
            if (nc) this->Read(&vec[0], nc);
        }
        else{
          for (c = 0; c < nc; c++) {
            vec[c].Read(*this, context);
          }
        }
    }